

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void osgen_gridwin_resize(osgen_gridwin_t *win,size_t new_wid,size_t new_ht)

{
  char *pcVar1;
  osgen_charcolor_t *poVar2;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t y;
  osgen_charcolor_t *cdst;
  osgen_charcolor_t *csrc;
  char *tdst;
  char *tsrc;
  osgen_charcolor_t *new_color;
  char *new_txt;
  ulong local_50;
  osgen_charcolor_t *local_48;
  void *local_40;
  char *local_38;
  void *local_30;
  ulong local_18;
  size_t local_10;
  
  if ((*(ulong *)(in_RDI + 0x70) < in_RSI) || (*(ulong *)(in_RDI + 0x78) < in_RDX)) {
    local_10 = in_RSI;
    if (in_RSI < *(ulong *)(in_RDI + 0x70)) {
      local_10 = *(size_t *)(in_RDI + 0x70);
    }
    local_18 = in_RDX;
    if (in_RDX < *(ulong *)(in_RDI + 0x78)) {
      local_18 = *(ulong *)(in_RDI + 0x78);
    }
    pcVar1 = (char *)malloc(local_10 * local_18);
    poVar2 = (osgen_charcolor_t *)malloc(local_10 * local_18 * 2);
    local_30 = *(void **)(in_RDI + 0x80);
    local_40 = *(void **)(in_RDI + 0x88);
    local_48 = poVar2;
    local_38 = pcVar1;
    for (local_50 = 0; local_50 < *(ulong *)(in_RDI + 0x78); local_50 = local_50 + 1) {
      memcpy(local_38,local_30,*(size_t *)(in_RDI + 0x70));
      memcpy(local_48,local_40,*(long *)(in_RDI + 0x70) << 1);
      osgen_gridwin_clear_ptr
                (local_38 + *(long *)(in_RDI + 0x70),local_48 + *(long *)(in_RDI + 0x70),
                 local_10 - *(long *)(in_RDI + 0x70));
      local_30 = (void *)(*(long *)(in_RDI + 0x70) + (long)local_30);
      local_40 = (void *)(*(long *)(in_RDI + 0x70) * 2 + (long)local_40);
      local_38 = local_38 + local_10;
      local_48 = local_48 + local_10;
    }
    for (; local_50 < local_18; local_50 = local_50 + 1) {
      osgen_gridwin_clear_ptr(local_38,local_48,local_10);
      local_38 = local_38 + local_10;
      local_48 = local_48 + local_10;
    }
    free(*(void **)(in_RDI + 0x80));
    free(*(void **)(in_RDI + 0x88));
    *(char **)(in_RDI + 0x80) = pcVar1;
    *(osgen_charcolor_t **)(in_RDI + 0x88) = poVar2;
    *(size_t *)(in_RDI + 0x70) = local_10;
    *(ulong *)(in_RDI + 0x78) = local_18;
  }
  return;
}

Assistant:

static void osgen_gridwin_resize(osgen_gridwin_t *win,
                                 size_t new_wid, size_t new_ht)
{
    /* if the window's size is now bigger than the grid, expand the grid */
    if (new_wid > win->grid_wid || new_ht > win->grid_ht)
    {
        char *new_txt;
        osgen_charcolor_t *new_color;
        char *tsrc, *tdst;
        osgen_charcolor_t *csrc, *cdst;
        size_t y;

        /*  
         *   use the larger of the old size and the new size, so that the
         *   window only expands (this somewhat simplifies copying the old
         *   to the new) 
         */
        if (win->grid_wid > new_wid)
            new_wid = win->grid_wid;
        if (win->grid_ht > new_ht)
            new_ht = win->grid_ht;

        /* allocate the new arrays */
        new_txt = (char *)osmalloc(new_wid * new_ht);
        new_color = (osgen_charcolor_t *)osmalloc(
            new_wid * new_ht * sizeof(new_color[0]));

        /* copy the old grid to the new grid */
        tsrc = win->grid_txt;
        csrc = win->grid_color;
        tdst = new_txt;
        cdst = new_color;
        for (y = 0 ; y < win->grid_ht ; ++y)
        {
            /* copy the old text and color data */
            memcpy(tdst, tsrc, win->grid_wid);
            memcpy(cdst, csrc, win->grid_wid * sizeof(cdst[0]));

            /* clear the rest of the line if expanding the width */
            osgen_gridwin_clear_ptr(tdst + win->grid_wid,
                                    cdst + win->grid_wid,
                                    new_wid - win->grid_wid);

            /* advance the pointers */
            tsrc += win->grid_wid;
            csrc += win->grid_wid;
            tdst += new_wid;
            cdst += new_wid;
        }

        /* clear all remaining lines */
        for ( ; y < new_ht ; ++y, tdst += new_wid, cdst += new_wid)
            osgen_gridwin_clear_ptr(tdst, cdst, new_wid);

        /* delete the old buffers */
        osfree(win->grid_txt);
        osfree(win->grid_color);

        /* set the new buffers and sizes */
        win->grid_txt = new_txt;
        win->grid_color = new_color;
        win->grid_wid = new_wid;
        win->grid_ht = new_ht;
    }
}